

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

int __thiscall
boost::runtime::parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true>::clone
          (parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *this,
          __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *p;
  
  p = (parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *)
      operator_new(0x120);
  basic_param::basic_param((basic_param *)p,(basic_param *)__fn);
  (p->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__parameter_001ca778;
  std::
  _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>_>
  ::_Rb_tree((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>_>
              *)&p->m_arg_factory,
             (_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::log_level>_>_>
              *)(__fn + 0xe8));
  uVar1 = *(undefined8 *)(__fn + 0x118);
  (p->m_arg_factory).m_optional_value = (int)uVar1;
  (p->m_arg_factory).m_default_value = (int)((ulong)uVar1 >> 0x20);
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::parameter<boost::unit_test::log_level,(boost::runtime::args_amount)0,true>>
            ((shared_ptr<boost::runtime::basic_param> *)this,p);
  return (int)this;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new parameter( *this ) );
    }